

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MmapReader.h
# Opt level: O2

void __thiscall MmapReader::file_helper::~file_helper(file_helper *this)

{
  __off_t __length;
  FileReader w;
  FileReader FStack_48;
  
  if (this->trunc == true) {
    FileReader::FileReader(&FStack_48,this);
    FileReader::truncate(&FStack_48,(char *)this->tsize,__length);
    FileReader::~FileReader(&FStack_48);
  }
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~file_helper()
        {
            if (trunc) {
                FileReader w(fname, FileReader::readwrite);
                w.truncate(tsize);
            }
        }